

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O2

Point<double> * __thiscall
Parfait::Facet::GetClosestPoint
          (Point<double> *__return_storage_ptr__,Facet *this,Point<double> safe)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  (__return_storage_ptr__->pos)._M_elems[2] = safe.pos._M_elems[2];
  (__return_storage_ptr__->pos)._M_elems[0] = safe.pos._M_elems[0];
  (__return_storage_ptr__->pos)._M_elems[1] = safe.pos._M_elems[1];
  dVar1 = (this->points)._M_elems[0].pos._M_elems[2];
  dVar11 = dVar1 - (__return_storage_ptr__->pos)._M_elems[2];
  dVar4 = (this->points)._M_elems[0].pos._M_elems[0];
  dVar3 = (this->points)._M_elems[0].pos._M_elems[1];
  dVar16 = dVar4 - (__return_storage_ptr__->pos)._M_elems[0];
  dVar17 = dVar3 - (__return_storage_ptr__->pos)._M_elems[1];
  dVar7 = (this->points)._M_elems[1].pos._M_elems[0] - dVar4;
  dVar8 = (this->points)._M_elems[1].pos._M_elems[1] - dVar3;
  dVar9 = (this->points)._M_elems[2].pos._M_elems[0] - dVar4;
  dVar10 = (this->points)._M_elems[2].pos._M_elems[1] - dVar3;
  dVar5 = (this->points)._M_elems[1].pos._M_elems[2] - dVar1;
  dVar6 = (this->points)._M_elems[2].pos._M_elems[2] - dVar1;
  dVar18 = dVar6 * dVar5 + dVar7 * dVar9 + dVar8 * dVar10;
  dVar14 = dVar5 * dVar5 + dVar7 * dVar7 + dVar8 * dVar8;
  dVar15 = dVar6 * dVar6 + dVar9 * dVar9 + dVar10 * dVar10;
  dVar12 = dVar11 * dVar5 + dVar16 * dVar7 + dVar17 * dVar8;
  dVar13 = dVar11 * dVar6 + dVar16 * dVar9 + dVar17 * dVar10;
  dVar17 = ABS(dVar15 * dVar14 - dVar18 * dVar18);
  dVar11 = dVar18 * dVar12 - dVar13 * dVar14;
  dVar16 = dVar18 * dVar13 - dVar12 * dVar15;
  if (dVar16 + dVar11 <= dVar17) {
    if (dVar16 < 0.0) {
      if ((0.0 <= dVar11) || (0.0 <= dVar12)) {
        dVar16 = 0.0;
        dVar11 = 0.0;
        if (0.0 <= dVar13) goto LAB_00108dff;
        if (dVar15 <= -dVar13) goto LAB_00108dc6;
LAB_00108dba:
        dVar11 = -dVar13 / dVar15;
        dVar16 = 0.0;
        goto LAB_00108dff;
      }
    }
    else {
      if (0.0 <= dVar11) {
        dVar17 = 1.0 / dVar17;
        dVar11 = dVar11 * dVar17;
        dVar16 = dVar16 * dVar17;
        goto LAB_00108dff;
      }
      dVar11 = 0.0;
      dVar16 = 0.0;
      if (0.0 <= dVar12) goto LAB_00108dff;
    }
    if (-dVar12 < dVar14) {
LAB_00108ccc:
      dVar16 = -dVar12 / dVar14;
      dVar11 = 0.0;
      goto LAB_00108dff;
    }
LAB_00108df6:
    dVar11 = 0.0;
    dVar16 = 1.0;
  }
  else {
    if (0.0 <= dVar16) {
      if (0.0 <= dVar11) {
        dVar16 = ((dVar15 + dVar13) - dVar18) - dVar12;
        if (0.0 < dVar16) goto LAB_00108d49;
      }
      else {
        dVar17 = dVar14 + dVar12;
        if (dVar17 <= dVar18 + dVar13) {
          dVar11 = 0.0;
          dVar16 = 0.0;
          if (0.0 < dVar17) {
            if (0.0 <= dVar12) goto LAB_00108dff;
            goto LAB_00108ccc;
          }
          goto LAB_00108df6;
        }
        dVar17 = dVar17 - (dVar18 + dVar13);
        dVar15 = (dVar14 - (dVar18 + dVar18)) + dVar15;
        if (dVar17 < dVar15) {
          dVar11 = dVar17 / dVar15;
          dVar16 = 1.0 - dVar11;
          goto LAB_00108dff;
        }
      }
    }
    else {
      dVar16 = dVar15 + dVar13;
      if (dVar18 + dVar12 < dVar16) {
        dVar16 = dVar16 - (dVar18 + dVar12);
LAB_00108d49:
        dVar15 = (dVar14 - (dVar18 + dVar18)) + dVar15;
        if (dVar16 < dVar15) {
          dVar16 = dVar16 / dVar15;
          dVar11 = 1.0 - dVar16;
          goto LAB_00108dff;
        }
        goto LAB_00108df6;
      }
      if (0.0 < dVar16) {
        dVar11 = 0.0;
        dVar16 = 0.0;
        if (0.0 <= dVar13) goto LAB_00108dff;
        goto LAB_00108dba;
      }
    }
LAB_00108dc6:
    dVar11 = 1.0;
    dVar16 = 0.0;
  }
LAB_00108dff:
  dVar3 = dVar3 + dVar8 * dVar16 + dVar10 * dVar11;
  auVar2._8_4_ = SUB84(dVar3,0);
  auVar2._0_8_ = dVar4 + dVar7 * dVar16 + dVar9 * dVar11;
  auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
  *(undefined1 (*) [16])(__return_storage_ptr__->pos)._M_elems = auVar2;
  (__return_storage_ptr__->pos)._M_elems[2] = dVar6 * dVar11 + dVar1 + dVar5 * dVar16;
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Point<double> Parfait::Facet::GetClosestPoint(Point<double> safe) const {

    Point<double> point = safe;
    Point<double> diff = points[0] - point;
    const Point<double> edge0 = points[1] - points[0];
    const Point<double> edge1 = points[2] - points[0];

    double a00 = LocalMacroCrap::squaredMagnitude(edge0);
    double a01 = Point<double>::dot(edge0, edge1);
    double a11 = LocalMacroCrap::squaredMagnitude(edge1);
    double b0 = Point<double>::dot(diff, edge0);
    double b1 = Point<double>::dot(diff, edge1);
    double det = fabs(a00 * a11 - a01 * a01);
    double s = a01 * b1 - a11 * b0;
    double t = a01 * b0 - a00 * b1;
    /*
      \     |
       \reg2|
        \   |
         \  |
          \ |
           \|
            *points[1]
            |\
            | \
      reg3  |  \ reg1
            |   \
            |reg0\
            |     \
            |      \ points[0]
     -------*-------*------->s
            |P0      \
      reg4  | reg5    \ reg6
    */
    if (s + t <= det) {
        if (s < (double) 0) {
            if (t < (double) 0) {
                if (b0 < (double) 0) {
                    t = (double) 0;
                    if (-b0 >= a00)
                        s = (double) 1;
                    else
                        s = -b0 / a00;
                } else {
                    s = (double) 0;
                    if (b1 >= (double) 0)
                        t = (double) 0;
                    else if (-b1 >= a11)
                        t = (double) 1;
                    else
                        t = -b1 / a11;
                }
            } else {
                s = (double) 0;
                if (b1 >= (double) 0)
                    t = (double) 0;
                else if (-b1 >= a11)
                    t = (double) 1;
                else
                    t = -b1 / a11;
            }
        } else if (t < (double) 0) {
            t = (double) 0;
            if (b0 >= (double) 0)
                s = (double) 0;
            else if (-b0 >= a00)
                s = (double) 1;
            else
                s = -b0 / a00;
        } else {
            double invDet = ((double) 1) / det;
            s *= invDet;
            t *= invDet;
        }
    } else {
        double tmp0, tmpoints, numer, denom;

        if (s < (double) 0) {
            tmp0 = a01 + b0;
            tmpoints = a11 + b1;
            if (tmpoints > tmp0) {
                numer = tmpoints - tmp0;
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    s = (double) 1;
                    t = (double) 0;
                } else {
                    s = numer / denom;
                    t = (double) 1 - s;
                }
            } else {
                s = (double) 0;
                if (tmpoints <= (double) 0)
                    t = (double) 1;
                else if (b1 >= (double) 0)
                    t = (double) 0;
                else
                    t = -b1 / a11;
            }
        } else if (t < (double) 0) {
            tmp0 = a01 + b1;
            tmpoints = a00 + b0;
            if (tmpoints > tmp0) {
                numer = tmpoints - tmp0;
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    t = (double) 1;
                    s = (double) 0;
                } else {
                    t = numer / denom;
                    s = (double) 1 - t;
                }
            } else {
                t = (double) 0;
                if (tmpoints <= (double) 0)
                    s = (double) 1;
                else if (b0 >= (double) 0)
                    s = (double) 0;
                else
                    s = -b0 / a00;
            }
        } else {
            numer = a11 + b1 - a01 - b0;
            if (numer <= (double) 0) {
                s = (double) 0;
                t = (double) 1;
            } else {
                denom = a00 - ((double) 2) * a01 + a11;
                if (numer >= denom) {
                    s = (double) 1;
                    t = (double) 0;
                } else {
                    s = numer / denom;
                    t = (double) 1 - s;
                }
            }
        }
    }

    point = points[0] + s * edge0 + t * edge1;
    return point;
}